

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O3

int32_t borg_power_dynamic(void)

{
  byte bVar1;
  short sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  int *piVar5;
  borg_item_conflict *pbVar6;
  _Bool _Var7;
  int16_t iVar8;
  int16_t iVar9;
  int16_t iVar10;
  int16_t iVar11;
  int16_t iVar12;
  int16_t iVar13;
  int iVar14;
  int32_t iVar15;
  int iVar16;
  wchar_t wVar17;
  ulong uVar18;
  borg_magic *pbVar19;
  ushort uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int what;
  int iVar24;
  int when;
  int book;
  int iVar25;
  long lVar26;
  bool bVar27;
  
  if (borg_formulas.power.count < 1) {
    iVar23 = 0;
  }
  else {
    lVar26 = 0;
    iVar23 = 0;
    do {
      puVar3 = (undefined8 *)borg_formulas.power.items[lVar26];
      pcVar4 = (char *)puVar3[3];
      if (pcVar4 == (char *)0x0) {
LAB_00222036:
        piVar5 = (int *)*puVar3;
        if (piVar5 == (int *)0x0) {
          iVar14 = *(int *)((char *)puVar3[1] + 4);
          if (*(char *)puVar3[1] == '\x01') {
            iVar14 = borg_calculate_dynamic(iVar14,0);
          }
        }
        else {
          iVar14 = 0;
          iVar15 = calculate_from_value((value_sec *)puVar3[2],0);
          iVar22 = piVar5[1];
          if (iVar15 < piVar5[1]) {
            iVar22 = iVar15;
          }
          if (*piVar5 <= iVar22) {
            iVar25 = *piVar5 + -1;
            iVar14 = 0;
            do {
              iVar16 = *(int *)((char *)puVar3[1] + 4);
              if (*(char *)puVar3[1] == '\x01') {
                iVar16 = borg_calculate_dynamic(iVar16,iVar25);
              }
              iVar14 = iVar14 + iVar16;
              iVar25 = iVar25 + 1;
            } while (iVar22 != iVar25);
          }
        }
      }
      else {
        iVar14 = *(int *)(pcVar4 + 4);
        if (*pcVar4 == '\x01') {
          iVar14 = borg_calculate_dynamic(iVar14,0);
        }
        if (iVar14 != 0) goto LAB_00222036;
        iVar14 = 0;
      }
      iVar23 = iVar23 + iVar14;
      lVar26 = lVar26 + 1;
    } while (lVar26 < borg_formulas.power.count);
  }
  wVar17 = borg_spell_stat();
  if (L'\0' < wVar17) {
    iVar8 = spell_chance(L'\0');
    iVar23 = (100 - iVar8) * 100 + iVar23;
  }
  _Var7 = flag_has_dbg((player->state).pflags,3,4,"player->state.pflags","(PF_ZERO_FAIL)");
  iVar14 = iVar23;
  if (_Var7) {
    iVar8 = spell_chance(L'\0');
    iVar14 = iVar23 + 30000;
    if (0 < iVar8) {
      iVar14 = iVar23;
    }
  }
  pbVar6 = borg_items;
  uVar18 = (ulong)z_info->pack_size;
  iVar23 = iVar14;
  if (((borg_items[uVar18 + 7].iqty != '\0') &&
      (_Var7 = borg_ego_has_random_power(e_info + borg_items[uVar18 + 7].ego_idx), _Var7)) &&
     (iVar23 = iVar14 + 999999, pbVar6[uVar18 + 7].ident != false)) {
    iVar23 = iVar14;
  }
  if (borg.trait[0xf] < 0xf) {
    iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 6);
    if (200 < iVar8) {
      iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 6);
      iVar23 = iVar23 + iVar8 * -0xf + 3000;
    }
    iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 9);
    iVar14 = iVar23 + -0xfa;
    if (iVar8 < 0x1f) {
      iVar14 = iVar23;
    }
    iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 8);
    iVar22 = iVar14 + -0xfa;
    if (iVar8 < 0xb) {
      iVar22 = iVar14;
    }
    iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 0xb);
    iVar23 = iVar22 + -0xfa;
    if (iVar8 < 0x33) {
      iVar23 = iVar22;
    }
  }
  iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 6);
  iVar9 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 9);
  iVar10 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 8);
  iVar11 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 7);
  iVar12 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 10);
  iVar13 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 0xb);
  wVar17 = (player->class->magic).spell_weight;
  _Var7 = borg_can_cast();
  if ((_Var7) &&
     (uVar21 = ((int)iVar13 + (int)iVar12 + (int)iVar11 + (int)iVar10 + (int)iVar9 + (int)iVar8) -
               wVar17, 9 < (int)uVar21)) {
    iVar22 = borg.trait[0x20] / 100 - uVar21 / 10;
    iVar25 = 0;
    iVar14 = (uVar21 / 10) * -400;
    if (0x32 < iVar22 - 299U) {
      iVar14 = iVar25;
    }
    uVar21 = uVar21 / 10;
    iVar16 = uVar21 * -800;
    if (99 < iVar22 - 199U) {
      iVar16 = iVar25;
    }
    iVar24 = uVar21 * -0x640;
    if (99 < iVar22 - 99U) {
      iVar24 = iVar25;
    }
    iVar25 = uVar21 * -0xc80;
    if (0x62 < iVar22) {
      iVar25 = 0;
    }
    iVar23 = iVar16 + iVar14 + iVar25 + iVar23 + iVar24;
  }
  iVar14 = iVar23;
  if (((borg.trait[0x6a] - 0x19U < 0x10) && (borg.trait[0x2d] < 100000)) &&
     ((borg_items[z_info->pack_size].tval != '\x06' &&
      (iVar14 = iVar23 + 5000, borg.trait[0xff] != 1)))) {
    iVar14 = iVar23;
  }
  lVar26 = 0;
  do {
    if (borg.amt_book[lVar26] != 0) {
      if ((player->class->magic).books[lVar26].dungeon == false) {
        wVar17 = L'\0';
        uVar21 = 99;
        do {
          pbVar19 = borg_get_spell_entry((wchar_t)lVar26,wVar17);
          if (pbVar19 == (borg_magic *)0x0) break;
          if (pbVar19->level <= uVar21) {
            uVar21 = (uint)pbVar19->level;
          }
          wVar17 = wVar17 + L'\x01';
        } while (wVar17 != L'\t');
        if ((uVar21 < 6) || ((int)uVar21 < borg.trait[0x24] + 2)) {
          sVar2 = borg.amt_book[lVar26];
          iVar23 = iVar14 + 500000;
          if (sVar2 < 1) {
            iVar23 = iVar14;
          }
          iVar14 = iVar23;
          if (5 < *borg.trait) {
            uVar20 = (ushort)(0 < sVar2);
            do {
              if (sVar2 <= (short)uVar20) break;
              iVar14 = iVar14 + 10000;
              bVar27 = uVar20 == 0;
              uVar20 = 1;
            } while (bVar27);
          }
        }
      }
      else {
        wVar17 = L'\0';
        do {
          pbVar19 = borg_get_spell_entry((wchar_t)lVar26,wVar17);
          if (pbVar19 == (borg_magic *)0x0) break;
          iVar23 = iVar14;
          if (((int)(uint)pbVar19->level <= borg.trait[0x24]) &&
             (iVar23 = iVar14 + 15000, borg.trait[0x1f] < (int)(uint)pbVar19->power)) {
            iVar23 = iVar14;
          }
          iVar14 = iVar23;
          wVar17 = wVar17 + L'\x01';
        } while (wVar17 != L'\t');
      }
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 9);
  iVar22 = borg.trait[0x105] / 2;
  iVar23 = borg.trait[0x104] - iVar22;
  if (iVar23 != 0 && iVar22 <= borg.trait[0x104]) {
    uVar21 = (uint)z_info->pack_size - borg.trait[0x9e];
    if (-1 < (int)uVar21) {
      do {
        if (borg_items[uVar21].iqty != '\0') {
          if (borg_items[uVar21].aware == true) {
            if (borg_items[uVar21].tval == '\x1a') {
              bVar1 = borg_items[uVar21].sval;
              if (sv_potion_inc_str == (uint)bVar1) {
                return iVar14;
              }
              if (sv_potion_inc_int == (uint)bVar1) {
                return iVar14;
              }
              wVar17 = (wchar_t)bVar1;
              if (sv_potion_inc_wis == wVar17) {
                return iVar14;
              }
              if (sv_potion_inc_dex == wVar17) {
                return iVar14;
              }
              if (sv_potion_inc_con == wVar17) {
                return iVar14;
              }
              if (sv_potion_inc_all == wVar17) {
                return iVar14;
              }
            }
            else if (borg_items[uVar21].tval == '\x19') {
              bVar1 = borg_items[uVar21].sval;
              if (((sv_scroll_enchant_armor == (uint)bVar1) && (borg.trait[0xed] < 1000)) &&
                 (borg.trait[0xf0] != 0)) {
                return iVar14;
              }
              if (((sv_scroll_enchant_weapon_to_hit == (uint)bVar1) && (borg.trait[0xea] < 1000)) &&
                 (borg.trait[0xf1] != 0)) {
                return iVar14;
              }
              wVar17 = (wchar_t)bVar1;
              if (((sv_scroll_enchant_weapon_to_dam == wVar17) && (borg.trait[0xeb] < 1000)) &&
                 (borg.trait[0xf2] != 0)) {
                return iVar14;
              }
              if (sv_scroll_star_enchant_weapon == wVar17) {
                return iVar14;
              }
              if (sv_scroll_star_enchant_armor == wVar17) {
                return iVar14;
              }
            }
          }
          break;
        }
        bVar27 = 0 < (int)uVar21;
        uVar21 = uVar21 - 1;
      } while (bVar27);
    }
    iVar14 = (iVar23 / (borg.trait[0x105] / 10)) * -1000 + iVar14;
  }
  return iVar14;
}

Assistant:

int32_t borg_power_dynamic(void)
{
    int     i;
    int32_t total = 0;

    /* MAX is used for "any" */
    for (i = 0; i < borg_formulas.power.count; i++) {
        total += calc_power(borg_formulas.power.items[i]);
    }

    /* HUGE HACK need some extra stuff that is hard to make dynamic*/
    if (borg_spell_stat() > 0)
        total += (100 - spell_chance(0)) * 100;

    /* should try to get min fail to 0 */
    if (player_has(player, PF_ZERO_FAIL)) {
        /* other fail rates */
        if (spell_chance(0) < 1)
            total += 30000L;
    }

    /*
     * Hack-- Reward the borg for carrying a NON-ID items that have random
     * powers
     */
    if (borg_items[INVEN_OUTER].iqty) {
        borg_item *item = &borg_items[INVEN_OUTER];
        if (((borg_ego_has_random_power(&e_info[item->ego_idx])
                && !item->ident)))
            total += 999999L;
    }

    /*** Penalize armor weight ***/
    if (borg.trait[BI_STR_INDEX] < 15) {
        if (borg_item_weight(&borg_items[INVEN_BODY]) > 200)
            total -= (borg_item_weight(&borg_items[INVEN_BODY]) - 200) * 15;
        if (borg_item_weight(&borg_items[INVEN_HEAD]) > 30)
            total -= 250;
        if (borg_item_weight(&borg_items[INVEN_ARM]) > 10)
            total -= 250;
        if (borg_item_weight(&borg_items[INVEN_FEET]) > 50)
            total -= 250;
    }

    /* Compute the total armor weight */
    int cur_wgt = 0;
    cur_wgt += borg_item_weight(&borg_items[INVEN_BODY]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_HEAD]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_ARM]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_OUTER]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_HANDS]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_FEET]);

    /* Determine the weight allowance */
    int max_wgt = player->class->magic.spell_weight;

    /* Hack -- heavy armor hurts magic */
    if (borg_can_cast() && ((cur_wgt - max_wgt) / 10) > 0) {
        /* max sp must be calculated in case it changed with the armor */
        int max_sp = borg.trait[BI_SP_ADJ] / 100 + 1;
        max_sp -= ((cur_wgt - max_wgt) / 10);
        /* Mega-Hack -- Penalize heavy armor which hurts mana */
        if (max_sp >= 300 && max_sp <= 350)
            total -= (((cur_wgt - max_wgt) / 10) * 400L);
        if (max_sp >= 200 && max_sp <= 299)
            total -= (((cur_wgt - max_wgt) / 10) * 800L);
        if (max_sp >= 100 && max_sp <= 199)
            total -= (((cur_wgt - max_wgt) / 10) * 1600L);
        if (max_sp <= 99)
            total -= (((cur_wgt - max_wgt) / 10) * 3200L);
    }
    /* END MAJOR HACK */

    /* SECOND MAJOR HACK for inventory */

    /* Reward carrying a shovel if low level */
    if (borg.trait[BI_MAXDEPTH] <= 40 && borg.trait[BI_MAXDEPTH] >= 25
        && borg.trait[BI_GOLD] < 100000
        && borg_items[INVEN_WIELD].tval != TV_DIGGING
        && borg.trait[BI_ADIGGER] == 1)
        total += 5000L;

    /*** Hack -- books ***/
    /*   Reward books    */
    for (int book = 0; book < 9; book++) {
        /* No copies */
        if (!borg.amt_book[book])
            continue;

        /* The "hard" books */
        if (player->class->magic.books[book].dungeon) {
            int what;

            /* Scan the spells */
            for (what = 0; what < 9; what++) {
                borg_magic *as = borg_get_spell_entry(book, what);
                if (!as)
                    break;

                /* Track minimum level */
                if (as->level > borg.trait[BI_MAXCLEVEL])
                    continue;

                /* Track Mana req. */
                if (as->power > borg.trait[BI_MAXSP])
                    continue;

                /* Reward the book based on the spells I can cast */
                total += 15000L;
            }
        }

        /* The "easy" books */
        else {
            int what, when = 99;

            /* Scan the spells */
            for (what = 0; what < 9; what++) {
                borg_magic *as = borg_get_spell_entry(book, what);
                if (!as)
                    break;

                /* Track minimum level */
                if (as->level < when)
                    when = as->level;

                /* Track Mana req. */
                /* if (as->power < mana) mana = as->power; */
            }

            /* Hack -- Ignore "difficult" normal books */
            if ((when > 5) && (when >= borg.trait[BI_MAXCLEVEL] + 2))
                continue;
            /* if (mana > borg.trait[BI_MAXSP]) continue; */

            /* Reward the book */
            int k = 0;
            for (; k < 1 && k < borg.amt_book[book]; k++)
                total += 500000L;
            if (borg.trait[BI_STR] > 5)
                for (; k < 2 && k < borg.amt_book[book]; k++)
                    total += 10000L;
        }
    }

    /*  Hack -- Apply "encumbrance" from weight */

    /* XXX XXX XXX Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2) {
        /* *HACK*  when testing items, the borg puts them in the last empty
         */
        /* slot so this is POSSIBLY just a test item */
        borg_item *item = NULL;
        for (i = PACK_SLOTS; i >= 0; i--) {
            if (borg_items[i].iqty) {
                item = &borg_items[i];
                break;
            }
        }

        /* Some items will be used immediately and should not contribute to
         * encumbrance */
        if (item && item->iqty && item->aware
            && ((item->tval == TV_SCROLL
                    && ((item->sval == sv_scroll_enchant_armor
                            && borg.trait[BI_AENCH_ARM] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_A])
                        || (item->sval == sv_scroll_enchant_weapon_to_hit
                            && borg.trait[BI_AENCH_TOH] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_H])
                        || (item->sval == sv_scroll_enchant_weapon_to_dam
                            && borg.trait[BI_AENCH_TOD] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_D])
                        || item->sval == sv_scroll_star_enchant_weapon
                        || item->sval == sv_scroll_star_enchant_armor))
                || (item->tval == TV_POTION
                    && (item->sval == sv_potion_inc_str
                        || item->sval == sv_potion_inc_int
                        || item->sval == sv_potion_inc_wis
                        || item->sval == sv_potion_inc_dex
                        || item->sval == sv_potion_inc_con
                        || item->sval == sv_potion_inc_all)))) {
            /* No encumbrance penalty for purchasing these items */
        } else {
            total -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                      / (borg.trait[BI_CARRY] / 10) * 1000L);
        }
    }
    /* END SECOND MAJOR HACK */

    return total;
}